

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O0

UBool __thiscall
icu_63::StringTrieBuilder::BranchHeadNode::operator==(BranchHeadNode *this,Node *other)

{
  UBool UVar1;
  bool local_31;
  BranchHeadNode *o;
  Node *other_local;
  BranchHeadNode *this_local;
  
  if (this == (BranchHeadNode *)other) {
    this_local._7_1_ = true;
  }
  else {
    UVar1 = ValueNode::operator==(&this->super_ValueNode,other);
    if (UVar1 == '\0') {
      this_local._7_1_ = false;
    }
    else {
      local_31 = false;
      if (this->length == other[1].hash) {
        local_31 = this->next == (Node *)other[2].super_UObject._vptr_UObject;
      }
      this_local._7_1_ = local_31;
    }
  }
  return this_local._7_1_;
}

Assistant:

UBool
StringTrieBuilder::BranchHeadNode::operator==(const Node &other) const {
    if(this==&other) {
        return TRUE;
    }
    if(!ValueNode::operator==(other)) {
        return FALSE;
    }
    const BranchHeadNode &o=(const BranchHeadNode &)other;
    return length==o.length && next==o.next;
}